

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QList<QGesture_*> * __thiscall
QHash<QGesture_*,_QGestureRecognizer_*>::keys
          (QHash<QGesture_*,_QGestureRecognizer_*> *this,QGestureRecognizer **value)

{
  long lVar1;
  bool bVar2;
  QGestureRecognizer **ppQVar3;
  long *in_RDX;
  const_iterator *in_RSI;
  QList<QGesture_*> *in_RDI;
  long in_FS_OFFSET;
  QList<QGesture_*> *res;
  const_iterator i;
  parameter_type in_stack_ffffffffffffff98;
  QList<QGesture_*> *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QGesture **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QGesture_*>::QList((QList<QGesture_*> *)0x30e0a6);
  begin((QHash<QGesture_*,_QGestureRecognizer_*> *)CONCAT17(uVar4,in_stack_ffffffffffffffb8));
  while( true ) {
    end((QHash<QGesture_*,_QGestureRecognizer_*> *)this_00);
    bVar2 = const_iterator::operator!=((const_iterator *)this_00,(const_iterator *)in_RDI);
    if (!bVar2) break;
    ppQVar3 = const_iterator::value((const_iterator *)0x30e105);
    if (*ppQVar3 == (QGestureRecognizer *)*in_RDX) {
      const_iterator::key((const_iterator *)0x30e11c);
      QList<QGesture_*>::append((QList<QGesture_*> *)0x30e129,in_stack_ffffffffffffff98);
    }
    const_iterator::operator++(in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QList<Key> keys(const T &value) const
    {
        QList<Key> res;
        const_iterator i = begin();
        while (i != end()) {
            if (i.value() == value)
                res.append(i.key());
            ++i;
        }
        return res;
    }